

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Track::set_language(Track *this,char *language)

{
  size_t __n;
  void *pvVar1;
  char *in_RSI;
  long in_RDI;
  size_t length;
  
  if (in_RSI != (char *)0x0) {
    if (*(void **)(in_RDI + 0x18) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x18));
    }
    __n = strlen(in_RSI);
    pvVar1 = operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    *(void **)(in_RDI + 0x18) = pvVar1;
    if (*(long *)(in_RDI + 0x18) != 0) {
      memcpy(*(void **)(in_RDI + 0x18),in_RSI,__n);
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + __n) = 0;
    }
  }
  return;
}

Assistant:

void Track::set_language(const char* language) {
  if (language) {
    delete[] language_;

    const size_t length = strlen(language) + 1;
    language_ = new (std::nothrow) char[length];  // NOLINT
    if (language_) {
      memcpy(language_, language, length - 1);
      language_[length - 1] = '\0';
    }
  }
}